

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O2

int64_t cab_minimum_consume_cfdata(archive_read *a,int64_t consumed_bytes)

{
  short *psVar1;
  undefined1 uVar2;
  ushort uVar3;
  void *pvVar4;
  int *piVar5;
  uint *puVar6;
  int iVar7;
  uint32_t uVar8;
  long lVar9;
  ulong uVar10;
  cfdata *cfdata;
  size_t bytes;
  undefined1 *p;
  uint uVar11;
  ulong request;
  
  pvVar4 = a->format->data;
  piVar5 = *(int **)((long)pvVar4 + 0x38);
  if (*(short *)(*(long *)((long)pvVar4 + 0x28) + 6) == 0) {
    uVar10 = *(ulong *)(piVar5 + 4);
    request = consumed_bytes;
    if ((long)uVar10 < consumed_bytes) {
      request = uVar10;
    }
    *(short *)((long)piVar5 + 0xe) = *(short *)((long)piVar5 + 0xe) + (short)request;
    *(short *)((long)piVar5 + 10) = *(short *)((long)piVar5 + 10) - (short)request;
    consumed_bytes = consumed_bytes - request;
    *(ulong *)(piVar5 + 4) = uVar10 - request;
    if (request == 0) {
      return consumed_bytes;
    }
  }
  else {
    uVar3 = *(ushort *)((long)piVar5 + 0xe);
    lVar9 = (ulong)*(ushort *)(piVar5 + 3) - (ulong)uVar3;
    if (lVar9 != 0 && (ulong)uVar3 <= (ulong)*(ushort *)(piVar5 + 3)) {
      if (consumed_bytes <= lVar9) {
        lVar9 = consumed_bytes;
      }
      consumed_bytes = consumed_bytes - lVar9;
      *(ushort *)((long)piVar5 + 0xe) = uVar3 + (short)lVar9;
      *(short *)((long)piVar5 + 10) = *(short *)((long)piVar5 + 10) - (short)lVar9;
    }
    request = *(ulong *)(piVar5 + 4);
    if (request == 0) {
      return consumed_bytes;
    }
    piVar5[4] = 0;
    piVar5[5] = 0;
  }
  if ((*piVar5 == 0) || (p = *(undefined1 **)(piVar5 + 0xe), p == (undefined1 *)0x0))
  goto LAB_0013c7ef;
  iVar7 = piVar5[0xc];
  uVar10 = request;
  if (iVar7 == 0) {
LAB_0013c7a2:
    uVar11 = (uint)uVar10 & 3;
    if (0 < (int)(uVar10 & 0xfffffffffffffffc)) {
      uVar8 = cab_checksum_cfdata_4(p,uVar10 & 0xfffffffffffffffc,piVar5[10]);
      piVar5[10] = uVar8;
    }
    if ((uVar10 & 3) != 0) {
      memcpy(piVar5 + 0xb,p + (uVar10 - uVar11),(ulong)uVar11);
    }
    piVar5[0xc] = uVar11;
  }
  else {
    while( true ) {
      if ((3 < iVar7) || (uVar10 == 0)) break;
      uVar2 = *p;
      p = p + 1;
      piVar5[0xc] = iVar7 + 1;
      *(undefined1 *)((long)piVar5 + (long)iVar7 + 0x2c) = uVar2;
      iVar7 = piVar5[0xc];
      uVar10 = uVar10 - 1;
    }
    if (iVar7 == 4) {
      uVar8 = cab_checksum_cfdata_4(piVar5 + 0xb,4,piVar5[10]);
      piVar5[10] = uVar8;
      piVar5[0xc] = 0;
    }
    if (uVar10 != 0) goto LAB_0013c7a2;
  }
  piVar5[0xe] = 0;
  piVar5[0xf] = 0;
LAB_0013c7ef:
  __archive_read_consume(a,request);
  *(long *)((long)pvVar4 + 0x40) = *(long *)((long)pvVar4 + 0x40) + request;
  psVar1 = (short *)((long)piVar5 + 6);
  *psVar1 = *psVar1 - (short)request;
  if (*psVar1 == 0) {
    pvVar4 = a->format->data;
    puVar6 = *(uint **)((long)pvVar4 + 0x38);
    uVar11 = *puVar6;
    if (uVar11 != 0) {
      if ((long)(int)puVar6[0xc] != 0) {
        uVar8 = cab_checksum_cfdata(puVar6 + 0xb,(long)(int)puVar6[0xc],puVar6[10]);
        puVar6[10] = uVar8;
        puVar6[0xc] = 0;
      }
      if ((*(byte *)((long)pvVar4 + 0x54) & 4) == 0) {
        bytes = 4;
      }
      else {
        bytes = (ulong)*(byte *)((long)pvVar4 + 0x5d) + 4;
      }
      uVar8 = cab_checksum_cfdata((void *)(*(long *)(puVar6 + 8) + 4),bytes,puVar6[10]);
      puVar6[10] = uVar8;
      if (uVar8 != uVar11) {
        archive_set_error(&a->archive,0x54,"Checksum error CFDATA[%d] %x:%x in %d bytes",
                          (ulong)(*(int *)(*(long *)((long)pvVar4 + 0x28) + 0x58) - 1),(ulong)uVar11
                          ,(ulong)uVar8,(uint)(ushort)puVar6[1]);
        consumed_bytes = -0x19;
      }
    }
  }
  return consumed_bytes;
}

Assistant:

static int64_t
cab_minimum_consume_cfdata(struct archive_read *a, int64_t consumed_bytes)
{
	struct cab *cab = (struct cab *)(a->format->data);
	struct cfdata *cfdata;
	int64_t cbytes, rbytes;
	int err;

	cfdata = cab->entry_cfdata;
	rbytes = consumed_bytes;
	if (cab->entry_cffolder->comptype == COMPTYPE_NONE) {
		if (consumed_bytes < cfdata->unconsumed)
			cbytes = consumed_bytes;
		else
			cbytes = cfdata->unconsumed;
		rbytes -= cbytes; 
		cfdata->read_offset += (uint16_t)cbytes;
		cfdata->uncompressed_bytes_remaining -= (uint16_t)cbytes;
		cfdata->unconsumed -= cbytes;
	} else {
		cbytes = cfdata->uncompressed_avail - cfdata->read_offset;
		if (cbytes > 0) {
			if (consumed_bytes < cbytes)
				cbytes = consumed_bytes;
			rbytes -= cbytes;
			cfdata->read_offset += (uint16_t)cbytes;
			cfdata->uncompressed_bytes_remaining -= (uint16_t)cbytes;
		}

		if (cfdata->unconsumed) {
			cbytes = cfdata->unconsumed;
			cfdata->unconsumed = 0;
		} else
			cbytes = 0;
	}
	if (cbytes) {
		/* Compute the sum. */
		cab_checksum_update(a, (size_t)cbytes);

		/* Consume as much as the compressor actually used. */
		__archive_read_consume(a, cbytes);
		cab->cab_offset += cbytes;
		cfdata->compressed_bytes_remaining -= (uint16_t)cbytes;
		if (cfdata->compressed_bytes_remaining == 0) {
			err = cab_checksum_finish(a);
			if (err < 0)
				return (err);
		}
	}
	return (rbytes);
}